

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O0

void make_intp_array(int **array,int64_t size,int num_values)

{
  int *piVar1;
  long lVar2;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int64_t i;
  long local_20;
  
  if (first_original == 0) {
    first_original = 1;
    original = (int **)malloc(in_RSI << 3);
  }
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
    piVar1 = (int *)malloc(4);
    original[local_20] = piVar1;
    *(int **)(in_RDI + local_20 * 8) = piVar1;
    lVar2 = lrand48();
    **(undefined4 **)(in_RDI + local_20 * 8) = (int)(lVar2 % (long)in_EDX);
  }
  return;
}

Assistant:

void make_intp_array(int **array, int64_t size, int num_values) {
  int64_t i;

  if (first_original == 0) {
    first_original = 1;
    original = malloc(sizeof(int *) * size);
  }

  for (i = 0; i < size; i++) {
    array[i] = original[i] = malloc(sizeof(int));
    *(array[i]) = lrand48() % num_values;
  }
}